

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBufferCopy(StringRef InputData,Twine *BufferName)

{
  storage_type *psVar1;
  Twine *in_RCX;
  WritableMemoryBuffer *pWVar2;
  StringRef InputData_00;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  Buf;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  EStack_28;
  
  InputData_00.Data = (char *)InputData.Length;
  InputData_00.Length = (size_t)BufferName;
  getMemBufferCopyImpl(&EStack_28,InputData_00,in_RCX);
  if ((EStack_28._16_1_ & 1) == 0) {
    psVar1 = ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             ::getStorage(&EStack_28);
    pWVar2 = (psVar1->_M_t).
             super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
             .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl;
    (psVar1->_M_t).
    super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
    ._M_t.
    super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
    .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl =
         (WritableMemoryBuffer *)0x0;
  }
  else {
    pWVar2 = (WritableMemoryBuffer *)0x0;
  }
  *(WritableMemoryBuffer **)InputData.Data = pWVar2;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  ::~ErrorOr(&EStack_28);
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBufferCopy(StringRef InputData, const Twine &BufferName) {
  auto Buf = getMemBufferCopyImpl(InputData, BufferName);
  if (Buf)
    return std::move(*Buf);
  return nullptr;
}